

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddRawTransaction
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *in_RCX;
  ConfidentialTransactionController *in_RDI;
  undefined8 in_R8;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar4;
  Amount AVar5;
  ConfidentialTxOut *in_stack_00000010;
  long in_stack_00000018;
  Address dummy_addr;
  Address pegout_address;
  TxOutPegoutParameters *pegout_data;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
  *__range2_3;
  ConfidentialTxOut *txout;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *__range2_2;
  TxInPeginParameters *pegin_data;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_> *__range2_1;
  ConfidentialTxIn *txin;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *__range2;
  uint32_t kLockTimeDisabledSequence;
  ConfidentialTransactionController *ctxc;
  AbstractTransactionController *in_stack_fffffffffffff208;
  undefined4 uVar6;
  Address *in_stack_fffffffffffff210;
  string *in_stack_fffffffffffff218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  ConfidentialTransactionController *in_stack_fffffffffffff220;
  string *this_00;
  uint32_t in_stack_fffffffffffff228;
  uint32_t in_stack_fffffffffffff22c;
  ConfidentialAssetId *in_stack_fffffffffffff230;
  NetType_conflict in_stack_fffffffffffff238;
  undefined4 in_stack_fffffffffffff23c;
  Script *in_stack_fffffffffffff240;
  undefined7 in_stack_fffffffffffff248;
  undefined1 in_stack_fffffffffffff24f;
  BlockHash *in_stack_fffffffffffff298;
  ConfidentialAssetId *in_stack_fffffffffffff2a0;
  Amount *in_stack_fffffffffffff2a8;
  undefined8 in_stack_fffffffffffff2b0;
  Txid *in_stack_fffffffffffff2b8;
  undefined5 in_stack_fffffffffffff2c0;
  undefined1 in_stack_fffffffffffff2c5;
  undefined1 in_stack_fffffffffffff2c6;
  undefined1 in_stack_fffffffffffff2c7;
  uint32_t in_stack_fffffffffffff2d8;
  uint32_t in_stack_fffffffffffff2dc;
  uint32_t in_stack_fffffffffffff2e0;
  uint32_t in_stack_fffffffffffff2e4;
  ConfidentialAssetId local_cf8;
  int64_t local_cd0;
  undefined1 local_cc8;
  ConfidentialValue local_cc0;
  int64_t local_c98;
  undefined1 local_c90;
  int64_t local_b90;
  undefined1 local_b88;
  ConfidentialValue local_b80;
  Amount local_b58;
  _Base_ptr local_b48;
  undefined1 local_b40;
  string local_b38;
  undefined1 local_b18 [32];
  string local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  Pubkey local_ab8 [2];
  Address *in_stack_fffffffffffff578;
  BlockHash *in_stack_fffffffffffff580;
  ConfidentialAssetId *in_stack_fffffffffffff588;
  Amount *in_stack_fffffffffffff590;
  ConfidentialTransactionController *in_stack_fffffffffffff598;
  NetType in_stack_fffffffffffff5b0;
  Pubkey *in_stack_fffffffffffff5b8;
  Privkey *in_stack_fffffffffffff5c0;
  string *in_stack_fffffffffffff5c8;
  uint32_t in_stack_fffffffffffff5d0;
  ByteData *in_stack_fffffffffffff5d8;
  NetType in_stack_fffffffffffff5e0;
  Address *in_stack_fffffffffffff5e8;
  Address local_8b0;
  Address local_730;
  reference local_5b0;
  TxOutPegoutParameters *local_5a8;
  __normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
  local_5a0 [2];
  ConfidentialNonce local_590;
  ConfidentialAssetId local_568;
  int64_t local_540;
  undefined1 local_538;
  ConfidentialValue local_530;
  int64_t local_508;
  undefined1 local_500;
  Script local_4f8 [5];
  ConfidentialTxOut *local_3c8;
  __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
  local_3c0;
  __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
  local_3b8;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *local_3b0;
  reference local_3a8;
  TxInPeginParameters *local_3a0;
  __normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
  local_398;
  undefined8 local_390;
  Txid local_388 [12];
  Txid local_208 [12];
  reference local_88;
  __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_80;
  __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_78;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *local_70;
  uint32_t local_58;
  undefined1 local_51;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *local_50;
  undefined8 local_48;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *local_40;
  
  local_51 = 0;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  local_58 = AbstractTransactionController::GetLockTimeDisabledSequence();
  local_70 = local_40;
  local_78._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::begin
                 (local_40);
  local_80._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::end
                 (local_70);
  while (bVar2 = __gnu_cxx::operator!=(&local_78,&local_80), bVar2) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
               ::operator*(&local_78);
    uVar1 = local_58;
    uVar3 = core::AbstractTxIn::GetSequence(&local_88->super_AbstractTxIn);
    if (uVar1 == uVar3) {
      core::AbstractTxIn::GetTxid(local_208,&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2e4 = core::AbstractTxIn::GetVout(&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2e0 =
           AbstractTransactionController::GetDefaultSequence(in_stack_fffffffffffff208);
      ConfidentialTransactionController::AddTxIn
                ((ConfidentialTransactionController *)
                 CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                 (Txid *)in_stack_fffffffffffff230,in_stack_fffffffffffff22c,
                 in_stack_fffffffffffff228);
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)in_stack_fffffffffffff210);
      core::Txid::~Txid((Txid *)0x58d18b);
    }
    else {
      core::AbstractTxIn::GetTxid(local_388,&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2dc = core::AbstractTxIn::GetVout(&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2d8 = core::AbstractTxIn::GetSequence(&local_88->super_AbstractTxIn);
      ConfidentialTransactionController::AddTxIn
                ((ConfidentialTransactionController *)
                 CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                 (Txid *)in_stack_fffffffffffff230,in_stack_fffffffffffff22c,
                 in_stack_fffffffffffff228);
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)in_stack_fffffffffffff210);
      core::Txid::~Txid((Txid *)0x58d25a);
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
    ::operator++(&local_78);
  }
  local_390 = local_48;
  local_398._M_current =
       (TxInPeginParameters *)
       std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>::
       begin((vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              *)in_stack_fffffffffffff208);
  local_3a0 = (TxInPeginParameters *)
              std::
              vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              ::end((vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
                     *)in_stack_fffffffffffff208);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
                             *)in_stack_fffffffffffff210,
                            (__normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
                             *)in_stack_fffffffffffff208), bVar2) {
    local_3a8 = __gnu_cxx::
                __normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
                ::operator*(&local_398);
    in_stack_fffffffffffff208 = (AbstractTransactionController *)&local_3a8->claim_script;
    in_stack_fffffffffffff210 = (Address *)&local_3a8->mainchain_raw_tx;
    ConfidentialTransactionController::AddPeginWitness
              ((ConfidentialTransactionController *)
               CONCAT17(in_stack_fffffffffffff2c7,
                        CONCAT16(in_stack_fffffffffffff2c6,
                                 CONCAT15(in_stack_fffffffffffff2c5,in_stack_fffffffffffff2c0))),
               in_stack_fffffffffffff2b8,(uint32_t)((ulong)in_stack_fffffffffffff2b0 >> 0x20),
               in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
               (Script *)local_3a8,
               (ByteData *)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
               (ByteData *)CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0));
    __gnu_cxx::
    __normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
    ::operator++(&local_398);
  }
  local_3b0 = local_50;
  local_3b8._M_current =
       (ConfidentialTxOut *)
       std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
       begin(local_50);
  local_3c0._M_current =
       (ConfidentialTxOut *)
       std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::end
                 (local_3b0);
  while (bVar2 = __gnu_cxx::operator!=(&local_3b8,&local_3c0), bVar2) {
    local_3c8 = __gnu_cxx::
                __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
                ::operator*(&local_3b8);
    core::AbstractTxOut::GetLockingScript(local_4f8,&local_3c8->super_AbstractTxOut);
    core::ConfidentialTxOut::GetConfidentialValue(&local_530,local_3c8);
    AVar5 = core::ConfidentialValue::GetAmount(&local_530);
    local_540 = AVar5.amount_;
    local_538 = AVar5.ignore_check_;
    local_508 = local_540;
    local_500 = local_538;
    core::ConfidentialTxOut::GetAsset(&local_568,local_3c8);
    core::ConfidentialTxOut::GetNonce(&local_590,local_3c8);
    ConfidentialTransactionController::AddTxOut
              ((ConfidentialTransactionController *)
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240,
               (Amount *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
               in_stack_fffffffffffff230,
               (ConfidentialNonce *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)in_stack_fffffffffffff210);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x58d4eb);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x58d4f8);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x58d505);
    core::Script::~Script((Script *)in_stack_fffffffffffff210);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
    ::operator++(&local_3b8);
  }
  local_5a0[0]._M_current =
       (TxOutPegoutParameters *)
       std::
       vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>::
       begin((vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
              *)in_stack_fffffffffffff208);
  local_5a8 = (TxOutPegoutParameters *)
              std::
              vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
              ::end((vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
                     *)in_stack_fffffffffffff208);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
                        *)in_stack_fffffffffffff210,
                       (__normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
                        *)in_stack_fffffffffffff208);
    if (!bVar2) {
      core::ConfidentialTxOut::GetConfidentialValue(&local_b80,in_stack_00000010);
      AVar5 = core::ConfidentialValue::GetAmount(&local_b80);
      local_b90 = AVar5.amount_;
      local_b88 = AVar5.ignore_check_;
      local_b58.amount_ = local_b90;
      local_b58.ignore_check_ = (bool)local_b88;
      bVar2 = core::Amount::operator!=(&local_b58,0);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x58db0d);
      if (bVar2) {
        core::ConfidentialTxOut::GetConfidentialValue(&local_cc0,in_stack_00000010);
        AVar5 = core::ConfidentialValue::GetAmount(&local_cc0);
        local_cd0 = AVar5.amount_;
        local_cc8 = AVar5.ignore_check_;
        local_c98 = local_cd0;
        local_c90 = local_cc8;
        core::ConfidentialTxOut::GetAsset(&local_cf8,in_stack_00000010);
        ConfidentialTransactionController::AddTxOutFee
                  ((ConfidentialTransactionController *)
                   CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                   (Amount *)in_stack_fffffffffffff230,
                   (ConfidentialAssetId *)
                   CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                  ((ConfidentialTxOutReference *)in_stack_fffffffffffff210);
        core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x58dbd7);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x58dbe4);
      }
      return in_RDI;
    }
    local_5b0 = __gnu_cxx::
                __normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
                ::operator*(local_5a0);
    core::Address::Address(&local_730);
    bVar2 = core::Pubkey::IsValid(&local_5b0->online_pubkey);
    if (bVar2) {
      bVar2 = core::Privkey::IsInvalid((Privkey *)&local_5b0->master_online_key);
      uVar6 = (undefined4)((ulong)in_stack_fffffffffffff208 >> 0x20);
      if (bVar2) goto LAB_0058d79d;
      core::Address::Address(&local_8b0);
      in_stack_fffffffffffff210 = (Address *)&local_5b0->online_pubkey;
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_5b0->master_online_key;
      this_00 = &local_5b0->bitcoin_descriptor;
      in_stack_fffffffffffff228 = local_5b0->bip32_counter;
      in_stack_fffffffffffff230 = (ConfidentialAssetId *)&local_5b0->whitelist;
      in_stack_fffffffffffff238 = local_5b0->elements_net_type;
      in_stack_fffffffffffff208 =
           (AbstractTransactionController *)CONCAT44(uVar6,local_5b0->net_type);
      ConfidentialTransactionController::AddPegoutTxOut
                (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                 in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff5b0,
                 in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5c8,
                 in_stack_fffffffffffff5d0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                 in_stack_fffffffffffff5e8);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)in_stack_fffffffffffff210);
      core::Address::~Address(in_stack_fffffffffffff210);
    }
    else {
LAB_0058d79d:
      core::Pubkey::Pubkey(local_ab8);
      core::Privkey::Privkey((Privkey *)&local_ad8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_af8,"",(allocator *)(local_b18 + 0x1f));
      core::ByteData::ByteData((ByteData *)local_b18);
      in_stack_fffffffffffff230 = (ConfidentialAssetId *)local_b18;
      this_00 = &local_af8;
      __args = &local_ad8;
      in_stack_fffffffffffff210 = (Address *)local_ab8;
      in_stack_fffffffffffff238 = kCfdOutOfRangeError;
      in_stack_fffffffffffff228 = 0;
      in_stack_fffffffffffff208 =
           (AbstractTransactionController *)((ulong)in_stack_fffffffffffff208 & 0xffffffff00000000);
      ConfidentialTransactionController::AddPegoutTxOut
                (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                 in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff5b0,
                 in_stack_fffffffffffff5b8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5c8,
                 in_stack_fffffffffffff5d0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,
                 in_stack_fffffffffffff5e8);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)in_stack_fffffffffffff210);
      core::ByteData::~ByteData((ByteData *)0x58d8dc);
      std::__cxx11::string::~string((string *)&local_af8);
      std::allocator<char>::~allocator((allocator<char> *)(local_b18 + 0x1f));
      core::Privkey::~Privkey((Privkey *)0x58d903);
      core::Pubkey::~Pubkey((Pubkey *)0x58d910);
    }
    if (in_stack_00000018 != 0) {
      core::Address::GetAddress_abi_cxx11_(&local_b38,&local_730);
      pVar4 = std::
              map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              ::emplace<std::__cxx11::string,cfd::core::Amount_const&>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                          *)this_00,__args,(Amount *)in_stack_fffffffffffff210);
      local_b48 = (_Base_ptr)pVar4.first._M_node;
      local_b40 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_b38);
    }
    core::Address::~Address(in_stack_fffffffffffff210);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
    ::operator++(local_5a0);
  } while( true );
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddRawTransaction(
    const std::string& tx_hex, const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(tx_hex);

  const uint32_t kLockTimeDisabledSequence =
      ctxc.GetLockTimeDisabledSequence();
  for (const auto& txin : txins) {
    // Create TxIn's unlocking_script as empty.
    if (kLockTimeDisabledSequence == txin.GetSequence()) {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), ctxc.GetDefaultSequence());
    } else {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
    }
  }

  for (const auto& pegin_data : pegins) {
    ctxc.AddPeginWitness(
        pegin_data.txid, pegin_data.vout, pegin_data.amount, pegin_data.asset,
        pegin_data.mainchain_blockhash, pegin_data.claim_script,
        pegin_data.mainchain_raw_tx, pegin_data.mainchain_txoutproof);
  }

  for (const auto& txout : txouts) {
    ctxc.AddTxOut(
        txout.GetLockingScript(), txout.GetConfidentialValue().GetAmount(),
        txout.GetAsset(), txout.GetNonce());
  }

  for (const auto& pegout_data : pegouts) {
    Address pegout_address;
    if (pegout_data.online_pubkey.IsValid() &&
        !pegout_data.master_online_key.IsInvalid()) {
      Address dummy_addr;
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
          pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
          pegout_data.bip32_counter, pegout_data.whitelist,
          pegout_data.elements_net_type, &pegout_address);
    } else {
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          pegout_data.btc_address);
    }
    if (pegout_addresses != nullptr) {
      pegout_addresses->emplace(
          pegout_address.GetAddress(), pegout_data.amount);
    }
  }

  // A fee with an amount of 0 is considered invalid.
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}